

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

bool __thiscall
r_comp::Compiler::indirection
          (Compiler *this,Ptr *node,Class *reference_class,string *path,
          vector<short,_std::allocator<short>_> *indices,ReturnType expected_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Metadata *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Class *pCVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  iterator iVar7;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  iterator iVar11;
  _Alloc_hider _Var12;
  uint16_t index;
  Class *fetched_class;
  string name;
  uint16_t local_fe;
  ReturnType local_fc;
  key_type local_f8;
  Class *local_d8;
  Compiler *local_d0;
  Class *local_c8;
  ReturnType local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Ptr *local_98;
  Ptr local_90;
  Ptr local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_f8.field_2;
  local_d8 = reference_class;
  local_d0 = this;
  local_bc = expected_type;
  local_98 = node;
  do {
    if (path->_M_string_length == 0) goto LAB_001277bb;
    lVar6 = std::__cxx11::string::find((char *)path,0x13f7ab,0);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)path);
    iVar5 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar5 == 0) {
      this_00 = local_d0->_metadata;
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"pgm_view","");
      iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this_00,&local_f8);
      local_c8 = (Class *)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                 ._M_cur + 0x28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      local_f8._M_dataplus._M_p._0_2_ = 0xffff;
      iVar11._M_current =
           (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                  (indices,iVar11,(short *)&local_f8);
      }
      else {
        *iVar11._M_current = -1;
        (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar11._M_current + 1;
      }
      local_fc = ANY;
LAB_0012753d:
      pCVar3 = local_c8;
      if (lVar6 == -1) {
        iVar5 = 3;
      }
      else {
        if (local_c8 == (Class *)0x0) {
          std::operator+(&local_b8," error: ",&local_70);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
          psVar10 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_f8.field_2._M_allocated_capacity = *psVar10;
            local_f8.field_2._8_8_ = plVar8[3];
            local_f8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar10;
            local_f8._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_f8._M_string_length = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (local_98->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
          local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (local_98->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          set_error(local_d0,&local_f8,&local_90);
          if (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar1) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          pbVar2 = &local_b8;
          _Var12._M_p = local_b8._M_dataplus._M_p;
          goto LAB_0012777a;
        }
        iVar5 = 0;
        std::__cxx11::string::erase((ulong)path,0);
        local_d8 = pCVar3;
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar5 == 0) {
        local_c8 = (Class *)0x0;
        local_f8._M_dataplus._M_p._0_2_ = 0xfffe;
        iVar11._M_current =
             (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                    (indices,iVar11,(short *)&local_f8);
        }
        else {
          *iVar11._M_current = -2;
LAB_0012748d:
          local_c8 = (Class *)0x0;
          (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar11._M_current + 1;
        }
LAB_00127535:
        local_fc = SET;
        goto LAB_0012753d;
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar5 == 0) {
        local_c8 = (Class *)0x0;
        local_f8._M_dataplus._M_p._0_2_ = 0xfffd;
        iVar11._M_current =
             (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar11._M_current !=
            (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *iVar11._M_current = -3;
          goto LAB_0012748d;
        }
        std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                  (indices,iVar11,(short *)&local_f8);
        goto LAB_00127535;
      }
      bVar4 = Class::get_member_index(local_d8,local_d0->_metadata,&local_70,&local_fe,&local_c8);
      if (bVar4) {
        local_fc = Class::get_member_type(local_d8,local_fe);
        local_f8._M_dataplus._M_p._0_2_ = local_fe;
        iVar11._M_current =
             (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                    (indices,iVar11,(short *)&local_f8);
        }
        else {
          *iVar11._M_current = local_fe;
          (indices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar11._M_current + 1;
        }
        goto LAB_0012753d;
      }
      std::operator+(&local_50," error: ",&local_70);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_b8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_b8,(ulong)(local_d8->str_opcode)._M_dataplus._M_p);
      psVar10 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_f8.field_2._M_allocated_capacity = *psVar10;
        local_f8.field_2._8_8_ = puVar9[3];
        local_f8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar10;
        local_f8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_f8._M_string_length = puVar9[1];
      *puVar9 = psVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (local_98->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (local_98->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      set_error(local_d0,&local_f8,&local_80);
      if (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      pbVar2 = &local_50;
      _Var12._M_p = local_50._M_dataplus._M_p;
LAB_0012777a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var12._M_p != &pbVar2->field_2) {
        operator_delete(_Var12._M_p);
      }
      iVar5 = 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  } while (iVar5 == 0);
  if (iVar5 == 3) {
LAB_001277bb:
    bVar4 = local_bc == ANY || local_fc == local_bc;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Compiler::indirection(RepliStruct::Ptr node, Class *reference_class, std::string path, std::vector<int16_t> *indices, const ReturnType expected_type)
{
    uint16_t index;
    Class *fetched_class;
    ReturnType type;

    while (path.length() > 0) {
        size_t pos = path.find(".");
        std::string name = path.substr(0, pos);

        if (name == "vw") {
            fetched_class = &_metadata->classes.find("pgm_view")->second;
            type = ANY;
            indices->push_back(-1);
        } else if (name == "mks") {
            fetched_class = nullptr;
            type = SET;
            indices->push_back(-2);
        } else if (name == "vws") {
            fetched_class = nullptr;
            type = SET;
            indices->push_back(-3);
        } else if (!reference_class->get_member_index(_metadata, name, index, fetched_class)) {
            set_error(" error: " + name + " is not a member of " + reference_class->str_opcode, node);
            return false;
        } else {
            type = reference_class->get_member_type(index);
            indices->push_back(index);
        }

        // No more dots
        if (pos == std::string::npos) {
            break;
        }

        if (!fetched_class) {
            set_error(" error: " + name + " is not an addressable structure", node);
            return false;
        }

        reference_class = fetched_class;
        path.erase(0, pos + 1); // Remove fetched name + .
    }

    if (type == expected_type || expected_type == ANY) {
        return true;
    } else {
        return false;
    }
}